

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImNodes.cpp
# Opt level: O0

void ImNodes::BeginCanvas(CanvasState *canvas)

{
  bool bVar1;
  ImGuiID id;
  ImGuiWindow *pIVar2;
  ImDrawList *this;
  ImGuiIO *pIVar3;
  float fVar4;
  ImVec2 local_a0;
  ImVec2 local_98;
  ImVec2 local_90;
  ImVec2 local_88;
  float local_80;
  float y;
  ImVec2 local_74;
  ImVec2 local_6c;
  ImVec2 local_64;
  float local_5c;
  undefined8 uStack_58;
  float x;
  undefined8 local_50;
  ImU32 local_48;
  float fStack_44;
  ImU32 grid_color;
  ImVec2 size;
  ImVec2 pos;
  float grid;
  ImGuiIO *io;
  ImDrawList *draw_list;
  ImGuiWindow *w;
  CanvasState *canvas_local;
  
  canvas->_impl->prev_canvas = gCanvas;
  gCanvas = canvas;
  pIVar2 = ImGui::GetCurrentWindow();
  ImGui::PushID(canvas);
  id = ImGui::GetID("canvas");
  ImGui::ItemAdd(&pIVar2->ContentsRegionRect,id,(ImRect *)0x0);
  this = ImGui::GetWindowDrawList();
  pIVar3 = ImGui::GetIO();
  bVar1 = ImGui::IsMouseDown(0);
  if ((!bVar1) && (bVar1 = ImGui::IsWindowHovered(0), bVar1)) {
    bVar1 = ImGui::IsMouseDragging(1,-1.0);
    if (bVar1) {
      operator+=(&canvas->offset,&pIVar3->MouseDelta);
    }
    if (((pIVar3->KeyShift & 1U) != 0) && ((pIVar3->KeyCtrl & 1U) == 0)) {
      (canvas->offset).x = pIVar3->MouseWheel * 16.0 + (canvas->offset).x;
    }
    if (((pIVar3->KeyShift & 1U) == 0) && ((pIVar3->KeyCtrl & 1U) == 0)) {
      (canvas->offset).y = pIVar3->MouseWheel * 16.0 + (canvas->offset).y;
    }
    if (((pIVar3->KeyShift & 1U) == 0) && ((pIVar3->KeyCtrl & 1U) != 0)) {
      if ((pIVar3->MouseWheel != 0.0) || (NAN(pIVar3->MouseWheel))) {
        fVar4 = ImClamp<float>(canvas->zoom + (pIVar3->MouseWheel * canvas->zoom) / 16.0,0.3,3.0);
        canvas->zoom = fVar4;
      }
      register0x00001200 = ImGui::GetMouseDragDelta(0,-1.0);
      operator+=(&canvas->offset,(ImVec2 *)&pos.y);
    }
  }
  pos.x = canvas->zoom * 64.0;
  size = ImGui::GetWindowPos();
  _fStack_44 = ImGui::GetWindowSize();
  uStack_58._0_4_ = canvas->colors[0].Value.x;
  uStack_58._4_4_ = canvas->colors[0].Value.y;
  local_50._0_4_ = canvas->colors[0].Value.z;
  local_50._4_4_ = canvas->colors[0].Value.w;
  local_48 = ImColor::operator_cast_to_unsigned_int((ImColor *)&uStack_58);
  for (local_5c = fmodf((canvas->offset).x,pos.x); local_5c < fStack_44; local_5c = pos.x + local_5c
      ) {
    ImVec2::ImVec2(&local_6c,local_5c,0.0);
    local_64 = operator+(&local_6c,&size);
    ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff84,local_5c,(float)grid_color);
    local_74 = operator+((ImVec2 *)&stack0xffffffffffffff84,&size);
    ImDrawList::AddLine(this,&local_64,&local_74,local_48,1.0);
  }
  for (local_80 = fmodf((canvas->offset).y,pos.x); local_80 < (float)grid_color;
      local_80 = pos.x + local_80) {
    ImVec2::ImVec2(&local_90,0.0,local_80);
    local_88 = operator+(&local_90,&size);
    ImVec2::ImVec2(&local_a0,fStack_44,local_80);
    local_98 = operator+(&local_a0,&size);
    ImDrawList::AddLine(this,&local_88,&local_98,local_48,1.0);
  }
  ImGui::SetWindowFontScale(canvas->zoom);
  return;
}

Assistant:

void BeginCanvas(CanvasState* canvas)
{
    canvas->_impl->prev_canvas = gCanvas;
    gCanvas = canvas;
    const ImGuiWindow* w = ImGui::GetCurrentWindow();
    ImGui::PushID(canvas);

    ImGui::ItemAdd(w->ContentsRegionRect, ImGui::GetID("canvas"));

    ImDrawList* draw_list = ImGui::GetWindowDrawList();
    ImGuiIO& io = ImGui::GetIO();

    if (!ImGui::IsMouseDown(0) && ImGui::IsWindowHovered())
    {
        if (ImGui::IsMouseDragging(1))
            canvas->offset += io.MouseDelta;

        if (io.KeyShift && !io.KeyCtrl)
            canvas->offset.x += io.MouseWheel * 16.0f;

        if (!io.KeyShift && !io.KeyCtrl)
            canvas->offset.y += io.MouseWheel * 16.0f;

        if (!io.KeyShift && io.KeyCtrl)
        {
            if (io.MouseWheel != 0)
                canvas->zoom = ImClamp(canvas->zoom + io.MouseWheel * canvas->zoom / 16.f, 0.3f, 3.f);
            canvas->offset += ImGui::GetMouseDragDelta();
        }
    }

    const float grid = 64.0f * canvas->zoom;

    ImVec2 pos = ImGui::GetWindowPos();
    ImVec2 size = ImGui::GetWindowSize();

    ImU32 grid_color = ImColor(canvas->colors[ColCanvasLines]);
    for (float x = fmodf(canvas->offset.x, grid); x < size.x;)
    {
        draw_list->AddLine(ImVec2(x, 0) + pos, ImVec2(x, size.y) + pos, grid_color);
        x += grid;
    }

    for (float y = fmodf(canvas->offset.y, grid); y < size.y;)
    {
        draw_list->AddLine(ImVec2(0, y) + pos, ImVec2(size.x, y) + pos, grid_color);
        y += grid;
    }

    ImGui::SetWindowFontScale(canvas->zoom);
}